

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O0

void poptPrintHelp(poptContext con,FILE *fp,int flags)

{
  columns_t columns_00;
  size_t sVar1;
  columns_t columns;
  int flags_local;
  FILE *fp_local;
  poptContext con_local;
  
  columns_00 = (columns_t)calloc(1,0x10);
  showHelpIntro(con,fp);
  if (con->otherHelp == (char *)0x0) {
    POPT_fprintf(fp," %s\n","[OPTION...]");
  }
  else {
    POPT_fprintf(fp," %s\n",con->otherHelp);
  }
  if (columns_00 != (columns_t)0x0) {
    sVar1 = maxArgWidth(con->options,(char *)0x0);
    columns_00->cur = sVar1;
    sVar1 = maxColumnWidth(fp);
    columns_00->max = sVar1;
    singleTableHelp(con,fp,con->options,columns_00,(char *)0x0);
    free(columns_00);
  }
  return;
}

Assistant:

void poptPrintHelp(poptContext con, FILE * fp, UNUSED(int flags))
{
    columns_t columns = calloc((size_t)1, sizeof(*columns));

    (void) showHelpIntro(con, fp);
    if (con->otherHelp)
	POPT_fprintf(fp, " %s\n", con->otherHelp);
    else
	POPT_fprintf(fp, " %s\n", POPT_("[OPTION...]"));

    if (columns) {
	columns->cur = maxArgWidth(con->options, NULL);
	columns->max = maxColumnWidth(fp);
	singleTableHelp(con, fp, con->options, columns, NULL);
	free(columns);
    }
}